

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  uint uVar1;
  char out [40];
  undefined1 local_38 [40];
  ulong __n;
  
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  if (len < 1) {
    __n = 0;
  }
  else {
    uVar1 = 0x1d;
    if (len - 1U < 0x1d) {
      uVar1 = len - 1U;
    }
    __n = (ulong)(uVar1 + 1);
    memcpy(local_38,ch,__n);
  }
  local_38[__n] = 0;
  fprintf(_stdout,"SAX.characters(%s, %d)\n",local_38,(ulong)(uint)len);
  return;
}

Assistant:

static void
charactersDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char out[40];
    int i;

    callbacks++;
    if (noout)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	out[i] = ch[i];
    out[i] = 0;

    fprintf(stdout, "SAX.characters(%s, %d)\n", out, len);
}